

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cpp
# Opt level: O3

string * anon_unknown.dwarf_6721f::prefix
                   (string *__return_storage_ptr__,bool prev_emitted,indent ind,string *property)

{
  pointer pcVar1;
  undefined8 uVar2;
  long *plVar3;
  string *psVar4;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  undefined7 in_register_00000031;
  char *pcVar7;
  long *local_b0;
  ulong local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar7 = "";
  if ((int)CONCAT71(in_register_00000031,prev_emitted) != 0) {
    pcVar7 = ",\n";
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)ind.distance_ * '\x02');
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,(ulong)pcVar7);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_a0 = *plVar5;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar5;
    local_b0 = (long *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_b0,local_a8,0,'\x01');
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_80 = *plVar5;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(property->_M_dataplus)._M_p);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  psVar4 = (string *)std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  paVar6 = &psVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar6) {
    uVar2 = *(undefined8 *)((long)&psVar4->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = psVar4->_M_string_length;
  (psVar4->_M_dataplus)._M_p = (pointer)paVar6;
  psVar4->_M_string_length = 0;
  (psVar4->field_2)._M_local_buf[0] = '\0';
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
    psVar4 = extraout_RAX;
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
    psVar4 = extraout_RAX_00;
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
    psVar4 = extraout_RAX_01;
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
    psVar4 = extraout_RAX_02;
  }
  return psVar4;
}

Assistant:

std::string prefix (bool prev_emitted, pstore::exchange::export_ns::indent const ind,
                        std::string const & property) {
        return (prev_emitted ? ",\n" : "") + ind.str () + '"' + property + "\":";
    }